

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<CborEncoder>::reallocateAndGrow
          (QArrayDataPointer<CborEncoder> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<CborEncoder> *old)

{
  long lVar1;
  bool bVar2;
  CborEncoder *pCVar3;
  QPodArrayOps<CborEncoder> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<CborEncoder> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<CborEncoder> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  CborEncoder *in_stack_ffffffffffffff70;
  CborEncoder *in_stack_ffffffffffffff78;
  QArrayDataPointer<CborEncoder> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<CborEncoder> *)in_stack_ffffffffffffff70), bVar2)) ||
     (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<CborEncoder> *)&DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (pCVar3 = data((QArrayDataPointer<CborEncoder> *)&stack0xffffffffffffffe0),
       pCVar3 == (CborEncoder *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_008e0604;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<CborEncoder> *)in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<CborEncoder> *)
                  operator->((QArrayDataPointer<CborEncoder> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<CborEncoder> *)0x8e0517);
        begin((QArrayDataPointer<CborEncoder> *)0x8e0526);
        QtPrivate::QPodArrayOps<CborEncoder>::copyAppend
                  (this_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (CborEncoder *)operator->((QArrayDataPointer<CborEncoder> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<CborEncoder> *)0x8e055f);
        begin((QArrayDataPointer<CborEncoder> *)0x8e056e);
        QtPrivate::QPodArrayOps<CborEncoder>::moveAppend
                  ((QPodArrayOps<CborEncoder> *)in_stack_ffffffffffffff70,
                   (CborEncoder *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (CborEncoder *)0x8e058c);
      }
    }
    swap((QArrayDataPointer<CborEncoder> *)in_stack_ffffffffffffff70,
         (QArrayDataPointer<CborEncoder> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<CborEncoder> *)in_stack_ffffffffffffff70,
           (QArrayDataPointer<CborEncoder> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer((QArrayDataPointer<CborEncoder> *)in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity((QArrayDataPointer<CborEncoder> *)in_stack_ffffffffffffff70);
    freeSpaceAtEnd((QArrayDataPointer<CborEncoder> *)in_stack_ffffffffffffff78);
    QtPrivate::QPodArrayOps<CborEncoder>::reallocate
              ((QPodArrayOps<CborEncoder> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_008e0604:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }